

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

void __thiscall
license::EventRegistry::exportLastEvents(EventRegistry *this,AuditEvent *auditEvents,int nlogs)

{
  size_type sVar1;
  int *piVar2;
  __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_> local_40;
  AuditEvent *local_38;
  __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_> local_30;
  int local_24;
  int local_20;
  int local_1c;
  int sizeToCopy;
  int nlogs_local;
  AuditEvent *auditEvents_local;
  EventRegistry *this_local;
  
  local_1c = nlogs;
  _sizeToCopy = auditEvents;
  auditEvents_local = (AuditEvent *)this;
  sVar1 = std::vector<AuditEvent,_std::allocator<AuditEvent>_>::size(&this->logs);
  local_24 = (int)sVar1;
  piVar2 = std::min<int>(&local_1c,&local_24);
  local_20 = *piVar2;
  local_30._M_current =
       (AuditEvent *)std::vector<AuditEvent,_std::allocator<AuditEvent>_>::begin(&this->logs);
  local_40._M_current =
       (AuditEvent *)std::vector<AuditEvent,_std::allocator<AuditEvent>_>::begin(&this->logs);
  local_38 = (AuditEvent *)
             __gnu_cxx::
             __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
             ::operator+(&local_40,(long)local_20);
  std::
  copy<__gnu_cxx::__normal_iterator<AuditEvent*,std::vector<AuditEvent,std::allocator<AuditEvent>>>,AuditEvent*>
            (local_30,(__normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
                       )local_38,_sizeToCopy);
  return;
}

Assistant:

void EventRegistry::exportLastEvents(AuditEvent* auditEvents, int nlogs) {
	int sizeToCopy = min(nlogs, (int) logs.size());
	std::copy(logs.begin(), logs.begin() + sizeToCopy, auditEvents);
}